

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnGetTest(XL *out,string *test_path)

{
  std::__cxx11::string::_M_assign((string *)test_path);
  return 0;
}

Assistant:

XL_DLL int XLearnGetTest(XL *out, std::string& test_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  test_path = xl->GetHyperParam().test_set_file;
  API_END();
}